

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O2

Wlc_Ntk_t * Wlc_NtkDupSingleNodes(Wlc_Ntk_t *p)

{
  ushort uVar1;
  int Id;
  int Id_00;
  Vec_Int_t *p_00;
  Wlc_Ntk_t *pNew;
  Wlc_Obj_t *pWVar2;
  Wlc_Obj_t *pWVar3;
  int iVar4;
  int iVar5;
  
  for (iVar4 = 1; iVar4 < p->iObj; iVar4 = iVar4 + 1) {
    Wlc_NtkObj(p,iVar4);
  }
  Wlc_NtkCleanCopy(p);
  p_00 = Vec_IntAlloc(100);
  pNew = Wlc_NtkAlloc(p->pName,p->nObjsAlloc);
  for (iVar4 = 1; iVar4 < p->iObj; iVar4 = iVar4 + 1) {
    pWVar2 = Wlc_NtkObj(p,iVar4);
    if ((((*(ushort *)pWVar2 & 0x3d) != 1) && (uVar1 = *(ushort *)pWVar2 & 0x3f, uVar1 != 0x26)) &&
       ((uVar1 != 8 || ((int)pWVar2->nFanins < 4)))) {
      for (iVar5 = 0; iVar5 < (int)pWVar2->nFanins; iVar5 = iVar5 + 1) {
        Id = Wlc_ObjFaninId(pWVar2,iVar5);
        pWVar3 = Wlc_NtkObj(p,Id);
        Id_00 = Wlc_ObjAlloc(pNew,1,*(uint *)pWVar3 >> 6 & 1,pWVar3->End,pWVar3->Beg);
        Wlc_NtkObj(pNew,Id_00);
        Vec_IntWriteEntry(&p->vCopies,Id,Id_00);
      }
      iVar5 = Wlc_ObjDup(pNew,p,iVar4,p_00);
      pWVar2 = Wlc_NtkObj(pNew,iVar5);
      pWVar2->field_0x1 = pWVar2->field_0x1 | 1;
      Vec_IntPush(&pNew->vPos,iVar5);
    }
  }
  Vec_IntFree(p_00);
  Wlc_NtkTransferNames(pNew,p);
  return pNew;
}

Assistant:

Wlc_Ntk_t * Wlc_NtkDupSingleNodes( Wlc_Ntk_t * p )
{
    Wlc_Ntk_t * pNew;
    Vec_Int_t * vFanins;
    Wlc_Obj_t * pObj, * pObjNew;
    Wlc_Obj_t * pFanin, * pFaninNew;
    int i, k, iFanin, iFaninNew, iObjNew, Count = 0;
    // count objects
    Wlc_NtkForEachObj( p, pObj, i )
        if ( !Wlc_ObjIsCi(pObj) )
            Count += 1 + Wlc_ObjFaninNum(pObj);
    // copy objects
    Wlc_NtkCleanCopy( p );
    vFanins = Vec_IntAlloc( 100 );
    pNew = Wlc_NtkAlloc( p->pName, p->nObjsAlloc );
    Wlc_NtkForEachObj( p, pObj, i )
    {
        if ( Wlc_ObjIsCi(pObj) )
            continue;
        if ( pObj->Type == WLC_OBJ_ARI_MULTI )
            continue;
        if ( pObj->Type == WLC_OBJ_MUX && Wlc_ObjFaninNum(pObj) > 3 )
            continue;
        // create CIs for the fanins
        Wlc_ObjForEachFanin( pObj, iFanin, k )
        {
            pFanin = Wlc_NtkObj(p, iFanin);
            iFaninNew = Wlc_ObjAlloc( pNew, WLC_OBJ_PI, pFanin->Signed, pFanin->End, pFanin->Beg );
            pFaninNew = Wlc_NtkObj(pNew, iFaninNew);
            Wlc_ObjSetCopy( p, iFanin, iFaninNew );
            //Wlc_ObjSetCi( pNew, pFaninNew );
        }
        // create object
        iObjNew = Wlc_ObjDup( pNew, p, i, vFanins );
        pObjNew = Wlc_NtkObj(pNew, iObjNew);
        pObjNew->fIsPo = 1;
        Vec_IntPush( &pNew->vPos, iObjNew );
    }
    Vec_IntFree( vFanins );
    Wlc_NtkTransferNames( pNew, p );
    return pNew;
}